

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_v4_serial.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  value_type vVar2;
  uint32_t *row_coo;
  uint32_t *col_coo;
  int iVar3;
  FILE *__stream;
  reference pvVar4;
  reference pvVar5;
  long lVar6;
  ostream *poVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  value_type vVar11;
  ulong uVar12;
  int j;
  uint uVar13;
  long lVar14;
  uint32_t *puVar15;
  size_type __n;
  int *piVar16;
  int nnz;
  int N;
  MM_typecode matcode;
  allocator_type local_189;
  ulong local_188;
  int M;
  size_type local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> J;
  vector<unsigned_int,_std::allocator<unsigned_int>_> I;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cscRow;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cscColumn;
  vector<unsigned_int,_std::allocator<unsigned_int>_> l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp1;
  vector<double,_std::allocator<double>_> val;
  vector<int,_std::allocator<int>_> result_vector;
  vector<unsigned_int,_std::allocator<unsigned_int>_> c_values;
  vector<int,_std::allocator<int>_> ones;
  vector<int,_std::allocator<int>_> c3;
  
  I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (argc < 2) {
    fprintf(_stderr,"Usage: %s [martix-market-filename] [0 for binary or 1 for non binary]\n",*argv)
    ;
  }
  else {
    __stream = fopen(argv[1],"r");
    if (__stream != (FILE *)0x0) {
      iVar3 = mm_read_banner((FILE *)__stream,&matcode);
      if (iVar3 == 0) {
        if (((matcode[2] == 'C') && (matcode[0] == 'M')) && (matcode[1] == 'C')) {
          printf("Sorry, this application does not support ");
          pcVar8 = mm_typecode_to_str(matcode);
          printf("Market Market type: [%s]\n",pcVar8);
        }
        else {
          iVar3 = mm_read_mtx_crd_size((FILE *)__stream,&M,&N,&nnz);
          if (iVar3 == 0) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&cscRow,(long)nnz,(allocator_type *)&cscColumn);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                      (&I,&cscRow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&cscRow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&cscRow,(long)nnz,(allocator_type *)&cscColumn);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                      (&J,&cscRow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&cscRow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)&cscRow,(long)nnz,
                       (allocator_type *)&cscColumn);
            std::vector<double,_std::allocator<double>_>::_M_move_assign
                      (&val,(_Vector_base<double,_std::allocator<double>_> *)&cscRow);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      ((_Vector_base<double,_std::allocator<double>_> *)&cscRow);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&cscRow,(long)nnz * 2,(allocator_type *)&cscColumn);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&cscColumn,(long)N + 1,(allocator_type *)&c_values);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&c_values,0,(allocator_type *)&temp1);
            if (matcode[2] == 'P') {
              lVar14 = 0;
              for (uVar12 = 0; uVar12 < (uint)nnz; uVar12 = uVar12 + 1) {
                __isoc99_fscanf(__stream,"%d %d\n",
                                (long)I.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar14,
                                (long)J.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar14);
                *(undefined8 *)
                 ((long)val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar14 * 2) = 0x3ff0000000000000;
                *(int *)((long)I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar14) =
                     *(int *)((long)I.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar14) + -1;
                *(int *)((long)J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar14) =
                     *(int *)((long)J.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar14) + -1;
                lVar14 = lVar14 + 4;
              }
            }
            else {
              lVar6 = 0;
              lVar14 = 0;
              for (uVar12 = 0; uVar12 < (uint)nnz; uVar12 = uVar12 + 1) {
                __isoc99_fscanf(__stream,"%d %d %lg\n",
                                (long)I.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar14,
                                (long)J.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar14,
                                (long)val.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar6);
                *(int *)((long)I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar14) =
                     *(int *)((long)I.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar14) + -1;
                *(int *)((long)J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar14) =
                     *(int *)((long)J.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar14) + -1;
                lVar14 = lVar14 + 4;
                lVar6 = lVar6 + 8;
              }
            }
            if (__stream != _stdin) {
              fclose(__stream);
            }
            if (M != N) {
              printf("COO matrix\' columns and rows are not the same");
            }
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&temp1,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(allocator_type *)&c3);
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&I,
                       (const_iterator)
                       I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&J,
                       (const_iterator)
                       J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )temp1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )temp1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
            if (temp1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                temp1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              temp1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   temp1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            puVar15 = (uint32_t *)&N;
            row_coo = J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            col_coo = I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (*I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start <
                *J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
              puVar15 = (uint32_t *)&M;
              row_coo = I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              col_coo = J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
            coo2csc(cscRow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    cscColumn.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,row_coo,col_coo,nnz * 2,*puVar15,0);
            std::vector<int,_std::allocator<int>_>::vector(&c3,0,(allocator_type *)&ones);
            result_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 1;
            std::vector<int,_std::allocator<int>_>::vector
                      (&ones,(long)N,(value_type_conflict2 *)&result_vector,(allocator_type *)&k);
            k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = 0;
            std::vector<int,_std::allocator<int>_>::vector
                      (&result_vector,(long)N,(value_type_conflict2 *)&k,(allocator_type *)&l);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&k,(long)nnz * 2,(allocator_type *)&l);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                      (&c_values,&k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
            ;
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            lVar14 = std::chrono::_V2::system_clock::now();
            uVar12 = 0;
            do {
              uVar13 = (uint)uVar12;
              if ((uint)N <= uVar13) {
                uVar12 = 0;
                while (uVar13 = (uint)uVar12, uVar13 < (uint)N) {
                  local_188 = (ulong)(uVar13 + 1);
                  uVar9 = uVar12 & 0xffffffff;
                  local_178 = (size_type)(int)uVar13;
                  uVar13 = 0;
                  while( true ) {
                    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                       (&cscColumn,local_188);
                    vVar11 = *pvVar4;
                    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                       (&cscColumn,uVar9);
                    uVar12 = local_188;
                    if (vVar11 - *pvVar4 <= uVar13) break;
                    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                       (&cscColumn,uVar9);
                    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                       (&cscRow,(ulong)(*pvVar4 + uVar13));
                    vVar11 = *pvVar4;
                    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                       (&cscColumn,uVar9);
                    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                       (&c_values,(ulong)(*pvVar4 + uVar13));
                    vVar2 = *pvVar4;
                    pvVar5 = std::vector<int,_std::allocator<int>_>::at(&ones,local_178);
                    iVar3 = *pvVar5;
                    pvVar5 = std::vector<int,_std::allocator<int>_>::at
                                       (&result_vector,(long)(int)vVar11);
                    *pvVar5 = *pvVar5 + iVar3 * vVar2;
                    uVar13 = uVar13 + 1;
                  }
                }
                for (piVar16 = (int *)CONCAT44(result_vector.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._4_4_,
                                               result_vector.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_);
                    piVar16 !=
                    result_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish; piVar16 = piVar16 + 1) {
                  k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start._0_4_ = *piVar16 / 2;
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&c3,(int *)&k);
                }
                lVar6 = std::chrono::_V2::system_clock::now();
                std::operator<<((ostream *)&std::cout,"Took ");
                poVar7 = std::ostream::_M_insert<double>((double)(lVar6 - lVar14) / 1000000000.0);
                std::endl<char,std::char_traits<char>>(poVar7);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&result_vector.super__Vector_base<int,_std::allocator<int>_>);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&ones.super__Vector_base<int,_std::allocator<int>_>);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&c3.super__Vector_base<int,_std::allocator<int>_>);
                std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          (&temp1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          (&c_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          );
                std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          (&cscColumn.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          (&cscRow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                          (&val.super__Vector_base<double,_std::allocator<double>_>);
                std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          (&J.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
                std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                          (&I.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
                return 0;
              }
              local_178 = (size_type)(uVar13 + 1);
              local_188 = uVar12 & 0xffffffff;
              uVar10 = 0;
LAB_001027b5:
              pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 (&cscColumn,local_178);
              vVar11 = *pvVar4;
              pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 (&cscColumn,local_188);
              uVar12 = local_178;
            } while (vVar11 - *pvVar4 <= uVar10);
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                               (&cscColumn,local_188);
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                               (&cscRow,(ulong)(*pvVar4 + uVar10));
            __n = (size_type)(int)*pvVar4;
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                               (&cscColumn,__n + 1);
            vVar11 = *pvVar4;
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&cscColumn,__n);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&k,(ulong)(vVar11 - *pvVar4),(allocator_type *)&l);
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                               (&cscColumn,(long)(int)(uVar13 + 1));
            vVar11 = *pvVar4;
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                               (&cscColumn,(long)(int)uVar13);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&l,(ulong)(vVar11 - *pvVar4),&local_189);
            lVar6 = CONCAT44(k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            for (uVar12 = 0;
                uVar12 < (ulong)((long)k.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - lVar6 >> 2);
                uVar12 = uVar12 + 1) {
              pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&cscColumn,__n);
              pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 (&cscRow,(ulong)(*pvVar4 + (int)uVar12));
              lVar6 = CONCAT44(k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               (int)k.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
              *(value_type *)(lVar6 + uVar12 * 4) = *pvVar4;
            }
            for (uVar12 = 0;
                uVar9 = (long)l.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)l.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2, uVar12 < uVar9;
                uVar12 = uVar12 + 1) {
              pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 (&cscColumn,(long)(int)uVar13);
              pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 (&cscRow,(ulong)(*pvVar4 + (int)uVar12));
              l.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12] = *pvVar4;
            }
            iVar3 = 0;
            uVar12 = 0;
            vVar11 = 0;
LAB_001028fb:
            do {
              uVar12 = (ulong)(int)uVar12;
              while( true ) {
                if (((long)k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     CONCAT44(k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 2 == (long)iVar3)
                   || (uVar9 == uVar12)) {
                  if (vVar11 != 0) {
                    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                       (&cscColumn,local_188);
                    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                       (&c_values,(ulong)(*pvVar4 + uVar10));
                    *pvVar4 = vVar11;
                  }
                  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                            (&l.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
                  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                            (&k.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
                  uVar10 = uVar10 + 1;
                  goto LAB_001027b5;
                }
                uVar1 = *(uint *)(CONCAT44(k.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (int)k.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start) +
                                 (long)iVar3 * 4);
                if (uVar1 == l.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar12]) {
                  vVar11 = vVar11 + 1;
                  iVar3 = iVar3 + 1;
                  uVar12 = (ulong)((int)uVar12 + 1);
                  goto LAB_001028fb;
                }
                if (uVar1 <= l.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar12]) break;
                uVar12 = uVar12 + 1;
              }
              iVar3 = iVar3 + 1;
            } while( true );
          }
        }
      }
      else {
        puts("Could not process Matrix Market banner.");
      }
    }
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv){
    int ret_code;
    MM_typecode matcode;
    FILE *f;
    int M, N, nnz;
    uint32_t i;
    std::vector<uint32_t> I, J;
    std::vector<double> val;

    if (argc < 2)
    {
        fprintf(stderr, "Usage: %s [martix-market-filename] [0 for binary or 1 for non binary]\n", argv[0]);
        exit(1);
    }
    else
    {
        if ((f = fopen(argv[1], "r")) == nullptr)
            exit(1);
    }

    if (mm_read_banner(f, &matcode) != 0)
    {
        printf("Could not process Matrix Market banner.\n");
        exit(1);
    }


    /*  This is how one can screen matrix types if their application */
    /*  only supports a subset of the Matrix Market data types.      */

    if (mm_is_complex(matcode) && mm_is_matrix(matcode) &&
        mm_is_sparse(matcode) )
    {
        printf("Sorry, this application does not support ");
        printf("Market Market type: [%s]\n", mm_typecode_to_str(matcode));
        exit(1);
    }

    /* find out size of sparse matrix .... */

    if ((ret_code = mm_read_mtx_crd_size(f, &M, &N, &nnz)) != 0)
        exit(1);


    I = std::vector<uint32_t>(nnz);
    J = std::vector<uint32_t>(nnz);
    val = std::vector<double>(nnz);

    std::vector<uint32_t> cscRow = std::vector<uint32_t>(2*nnz);
    std::vector<uint32_t> cscColumn = std::vector<uint32_t>(N+1);
    std::vector<uint32_t> c_values = std::vector<uint32_t>(0);

    /* NOTE: when reading in doubles, ANSI C requires the use of the "l"  */
    /*   specifier as in "%lg", "%lf", "%le", otherwise errors will occur */
    /*  (ANSI C X3.159-1989, Sec. 4.9.6.2, p. 136 lines 13-15)            */

    /* Replace missing val column with 1s and change the fscanf to match pattern matrices*/

    if (!mm_is_pattern(matcode)) {
        for (i = 0; i < nnz; i++) {
            fscanf(f, "%d %d %lg\n", &I[i], &J[i], &val[i]);
            I[i]--;  /* adjust from 1-based to 0-based */
            J[i]--;
        }
    } else {
        for (i = 0; i < nnz; i++) {
            fscanf(f, "%d %d\n", &I[i], &J[i]);
            val[i] = 1;
            I[i]--;  /* adjust from 1-based to 0-based */
            J[i]--;
        }
    }

    if (f !=stdin) fclose(f);

    if(M != N) {
        printf("COO matrix' columns and rows are not the same");
    }

    // create symmetric values
    std::vector<uint32_t> temp1 = std::vector<uint32_t>(I.begin(), I.end());
    I.insert(std::end(I), std::begin(J), std::end(J));
    J.insert(std::end(J), std::begin(temp1), std::end(temp1));
    temp1.clear();

    if (I[0] < J[0]) {
        coo2csc(&cscRow[0], &cscColumn[0], &I[0], &J[0], 2 * nnz, M, 0);
    } else {
        coo2csc(&cscRow[0], &cscColumn[0], &J[0], &I[0], 2 * nnz, N, 0);
    }

    std::vector<int>c3 = std::vector<int>(0);
    std::vector<int>ones = std::vector<int>(N, 1);
    std::vector<int>result_vector = std::vector<int>(N, 0);
    c_values = std::vector<uint32_t>(2*nnz);

    auto start = std::chrono::high_resolution_clock::now();

    for(i = 0; i < N; i++) {
        for(int j = 0; j < cscColumn.at(i+1) - cscColumn.at(i); j++) {
            int a_row = cscRow.at(cscColumn.at(i) + j);
            int a_col = i;

            std::vector<uint32_t> k = std::vector<uint32_t>(cscColumn.at(a_row+1) - cscColumn.at(a_row));
            std::vector<uint32_t> l = std::vector<uint32_t>(cscColumn.at(a_col+1) - cscColumn.at(a_col));

            int s;
            for(s = 0; s < k.size(); ++s) {
                k[s] = cscRow.at(cscColumn.at(a_row) + s);
            }
            for(s = 0; s < l.size(); ++s) {
                l[s] = cscRow.at(cscColumn.at(a_col) + s);
            }

            int m = 0;
            int n = 0;
            int mul_value = 0;

            while(m != k.size() && n != l.size()) {
                if(k[m] == l[n]) {
                    ++mul_value;
                    ++m;
                    ++n;
                } else if(k[m] > l[n]) {
                    ++n;
                } else{
                    ++m;
                }
            }

            if(mul_value) {
                c_values.at(cscColumn.at(i) + j) = mul_value;
            }
        }
    }

    for(i = 0; i < N; i++) {
        for(int j = 0; j < cscColumn.at(i+1) - cscColumn.at(i); j++) {
            int row = cscRow.at(cscColumn.at(i) + j);
            int col = i;
            int value = c_values.at(cscColumn.at(i) + j);
            result_vector.at(row) += value * ones.at(col);
        }
    }

    for(int res: result_vector){
        c3.push_back(res/2);
    }

    auto stop = std::chrono::high_resolution_clock::now();

    std::chrono::duration<double> elapsed = stop - start;
    std::cout<<"Took "<< elapsed.count() <<std::endl;

//    for(int item: c3){
//        std::cout<< item << " ";
//    }
    std::cout<<std::endl;

    return 0;
}